

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.c
# Opt level: O1

GLFWglproc glfwGetProcAddress(char *procname)

{
  _GLFWwindow *p_Var1;
  GLFWglproc p_Var2;
  int error;
  
  if (procname == (char *)0x0) {
    __assert_fail("procname != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/111116[P]shexp-demo/src/glfw/src/context.c"
                  ,0x2c3,"GLFWglproc glfwGetProcAddress(const char *)");
  }
  if (_glfwInitialized == 0) {
    error = 0x10001;
  }
  else {
    p_Var1 = _glfwPlatformGetCurrentContext();
    if (p_Var1 != (_GLFWwindow *)0x0) {
      p_Var2 = (*(p_Var1->context).getProcAddress)(procname);
      return p_Var2;
    }
    error = 0x10002;
  }
  _glfwInputError(error,(char *)0x0);
  return (GLFWglproc)0x0;
}

Assistant:

GLFWAPI GLFWglproc glfwGetProcAddress(const char* procname)
{
    _GLFWwindow* window;
    assert(procname != NULL);

    _GLFW_REQUIRE_INIT_OR_RETURN(NULL);

    window = _glfwPlatformGetCurrentContext();
    if (!window)
    {
        _glfwInputError(GLFW_NO_CURRENT_CONTEXT, NULL);
        return NULL;
    }

    return window->context.getProcAddress(procname);
}